

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O2

float GD::inline_predict(vw *all,example *ec)

{
  float fVar1;
  
  fVar1 = (ec->l).simple.initial;
  if ((all->weights).sparse == true) {
    fVar1 = inline_predict<sparse_parameters>
                      (&(all->weights).sparse_weights,all->ignore_some_linear,all->ignore_linear,
                       &all->interactions,all->permutations,&ec->super_example_predict,fVar1);
    return fVar1;
  }
  fVar1 = inline_predict<dense_parameters>
                    (&(all->weights).dense_weights,all->ignore_some_linear,all->ignore_linear,
                     &all->interactions,all->permutations,&ec->super_example_predict,fVar1);
  return fVar1;
}

Assistant:

inline float inline_predict(vw& all, example& ec)
{
  return all.weights.sparse ? inline_predict<sparse_parameters>(all.weights.sparse_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial)
                            : inline_predict<dense_parameters>(all.weights.dense_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial);
}